

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O1

long __thiscall Fl_Table::col_scroll_position(Fl_Table *this,int col)

{
  ulong uVar1;
  int t;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = 0;
  uVar3 = uVar1;
  if (this->leftcol <= col && (long)this->leftcol_scrollpos != 0xffffffffffffffff) {
    uVar1 = (long)this->leftcol_scrollpos;
    uVar3 = (ulong)(uint)this->leftcol;
  }
  if ((int)uVar3 < col) {
    do {
      iVar2 = (int)uVar3;
      if (iVar2 < 0) {
        lVar4 = 0;
      }
      else {
        lVar4 = 0;
        if (iVar2 < (int)(this->_colwidths)._size) {
          lVar4 = (long)(this->_colwidths).arr[uVar3];
        }
      }
      uVar1 = uVar1 + lVar4;
      uVar3 = (ulong)(iVar2 + 1U);
    } while (col != iVar2 + 1U);
  }
  return uVar1;
}

Assistant:

long Fl_Table::col_scroll_position(int col) {
  int startcol = 0;
  long scroll = 0;
  // OPTIMIZATION: 
  //     Attempt to use precomputed row scroll position
  //
  if ( leftcol_scrollpos != -1 && col >= leftcol ) {
    scroll = leftcol_scrollpos;
    startcol = leftcol;
  }
  for ( int t=startcol; t<col; t++ ) {
    scroll += col_width(t);
  }
  return(scroll);
}